

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OjaNewton.cc
# Opt level: O1

void __thiscall OjaNewton::check(OjaNewton *this)

{
  vw *pvVar1;
  bool bVar2;
  long lVar3;
  ulong uVar4;
  float *pfVar5;
  weight *pwVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  uint32_t i;
  ulong uVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  
  if (this->m < 1) {
    bVar2 = true;
  }
  else {
    lVar3 = (ulong)(uint)this->m + 1;
    dVar12 = 0.0;
    lVar7 = 1;
    lVar8 = 0;
    lVar9 = lVar3;
    do {
      lVar10 = 1;
      do {
        dVar13 = (double)ABS(*(float *)((long)this->K[lVar7] + lVar10 * 4 + lVar8));
        dVar14 = dVar13;
        if (dVar13 <= dVar12) {
          dVar14 = dVar12;
        }
        dVar12 = (double)(~-(ulong)NAN(dVar12) & (ulong)dVar14 | -(ulong)NAN(dVar12) & (ulong)dVar13
                         );
        lVar10 = lVar10 + 1;
      } while (lVar9 != lVar10);
      lVar7 = lVar7 + 1;
      lVar8 = lVar8 + 4;
      lVar9 = lVar9 + -1;
    } while (lVar7 != lVar3);
    bVar2 = dVar12 < 10000000.0;
  }
  if (!bVar2) {
    uVar4 = (ulong)(uint)this->m;
    if (0 < this->m) {
      lVar9 = 1;
      do {
        memset(this->tmp,0,(long)(int)uVar4 * 8 + 8);
        if (0 < this->m) {
          lVar3 = 1;
          do {
            if (0 < this->m) {
              lVar7 = 0;
              do {
                this->tmp[lVar3] =
                     this->A[lVar3][lVar7 + 1] * this->K[lVar7 + 1][lVar9] + this->tmp[lVar3];
                lVar7 = lVar7 + 1;
              } while (lVar7 < this->m);
            }
            bVar2 = lVar3 < this->m;
            lVar3 = lVar3 + 1;
          } while (bVar2);
        }
        if (0 < this->m) {
          lVar3 = 0;
          do {
            this->K[lVar3 + 1][lVar9] = this->tmp[lVar3 + 1];
            lVar3 = lVar3 + 1;
          } while (lVar3 < this->m);
        }
        uVar4 = (ulong)this->m;
        bVar2 = lVar9 < (long)uVar4;
        lVar9 = lVar9 + 1;
      } while (bVar2);
    }
    uVar4 = (ulong)(uint)this->m;
    if (0 < this->m) {
      lVar9 = 1;
      do {
        memset(this->tmp,0,(long)(int)uVar4 * 8 + 8);
        if (0 < this->m) {
          lVar3 = 1;
          do {
            if (0 < this->m) {
              lVar7 = 0;
              do {
                this->tmp[lVar3] =
                     this->K[lVar9][lVar7 + 1] * this->A[lVar3][lVar7 + 1] + this->tmp[lVar3];
                lVar7 = lVar7 + 1;
              } while (lVar7 < this->m);
            }
            bVar2 = lVar3 < this->m;
            lVar3 = lVar3 + 1;
          } while (bVar2);
        }
        if (0 < this->m) {
          lVar3 = 0;
          do {
            this->K[lVar9][lVar3 + 1] = this->tmp[lVar3 + 1];
            lVar3 = lVar3 + 1;
          } while (lVar3 < this->m);
        }
        uVar4 = (ulong)this->m;
        bVar2 = lVar9 < (long)uVar4;
        lVar9 = lVar9 + 1;
      } while (bVar2);
    }
    uVar11 = 1L << ((byte)this->all->num_bits & 0x3f);
    uVar4 = 0;
    do {
      pvVar1 = this->all;
      if ((pvVar1->weights).sparse == true) {
        pfVar5 = sparse_parameters::operator[]
                           (&(pvVar1->weights).sparse_weights,
                            uVar4 << ((byte)(pvVar1->weights).sparse_weights._stride_shift & 0x3f));
      }
      else {
        pfVar5 = (pvVar1->weights).dense_weights._begin +
                 (uVar4 << ((byte)(pvVar1->weights).dense_weights._stride_shift & 0x3f) &
                 (pvVar1->weights).dense_weights._weight_mask);
      }
      if (0 < this->m) {
        lVar9 = 0;
        do {
          *pfVar5 = pfVar5[lVar9 + 1] * this->b[lVar9 + 1] * this->D[lVar9 + 1] + *pfVar5;
          lVar9 = lVar9 + 1;
        } while (lVar9 < this->m);
      }
      uVar4 = uVar4 + 1;
    } while (uVar4 != uVar11);
    uVar4 = 0;
    memset(this->b,0,(long)this->m * 8 + 8);
    do {
      memset(this->tmp,0,(long)this->m * 4 + 4);
      pvVar1 = this->all;
      if ((pvVar1->weights).sparse == true) {
        pwVar6 = sparse_parameters::operator[]
                           (&(pvVar1->weights).sparse_weights,
                            uVar4 << ((byte)(pvVar1->weights).sparse_weights._stride_shift & 0x3f));
      }
      else {
        pwVar6 = (pvVar1->weights).dense_weights._begin +
                 (uVar4 << ((byte)(pvVar1->weights).dense_weights._stride_shift & 0x3f) &
                 (pvVar1->weights).dense_weights._weight_mask);
      }
      if (0 < this->m) {
        lVar9 = 1;
        do {
          if (0 < this->m) {
            lVar3 = 0;
            do {
              this->tmp[lVar9] =
                   this->A[lVar9][lVar3 + 1] * this->D[lVar3 + 1] * pwVar6[lVar3 + 1] +
                   this->tmp[lVar9];
              lVar3 = lVar3 + 1;
            } while (lVar3 < this->m);
          }
          bVar2 = lVar9 < this->m;
          lVar9 = lVar9 + 1;
        } while (bVar2);
      }
      if (0 < this->m) {
        lVar9 = 0;
        do {
          pwVar6[lVar9 + 1] = this->tmp[lVar9 + 1];
          lVar9 = lVar9 + 1;
        } while (lVar9 < this->m);
      }
      uVar4 = uVar4 + 1;
    } while (uVar4 != (uVar11 & 0xffffffff));
    uVar4 = (ulong)(uint)this->m;
    if (0 < this->m) {
      lVar9 = 0;
      do {
        memset(this->A[lVar9 + 1],0,(long)(int)uVar4 * 8 + 8);
        this->D[lVar9 + 1] = 1.0;
        this->A[lVar9 + 1][lVar9 + 1] = 1.0;
        uVar4 = (ulong)this->m;
        lVar9 = lVar9 + 1;
      } while (lVar9 < (long)uVar4);
    }
  }
  return;
}

Assistant:

void check()
  {
    double max_norm = 0;
    for (int i = 1; i <= m; i++)
      for (int j = i; j <= m; j++) max_norm = fmax(max_norm, fabs(K[i][j]));
    // printf("|K| = %f\n", max_norm);
    if (max_norm < 1e7)
      return;

    // implicit -> explicit representation
    // printf("begin conversion: t = %d, norm(K) = %f\n", t, max_norm);

    // first step: K <- AKA'

    // K <- AK
    for (int j = 1; j <= m; j++)
    {
      memset(tmp, 0, sizeof(double) * (m + 1));

      for (int i = 1; i <= m; i++)
      {
        for (int h = 1; h <= m; h++)
        {
          tmp[i] += A[i][h] * K[h][j];
        }
      }

      for (int i = 1; i <= m; i++) K[i][j] = tmp[i];
    }
    // K <- KA'
    for (int i = 1; i <= m; i++)
    {
      memset(tmp, 0, sizeof(double) * (m + 1));

      for (int j = 1; j <= m; j++)
        for (int h = 1; h <= m; h++) tmp[j] += K[i][h] * A[j][h];

      for (int j = 1; j <= m; j++)
      {
        K[i][j] = tmp[j];
      }
    }

    // second step: w[0] <- w[0] + (DZ)'b, b <- 0.

    uint32_t length = 1 << all->num_bits;
    for (uint32_t i = 0; i < length; i++)
    {
      weight& w = all->weights.strided_index(i);
      for (int j = 1; j <= m; j++) w += (&w)[j] * b[j] * D[j];
    }

    memset(b, 0, sizeof(double) * (m + 1));

    // third step: Z <- ADZ, A, D <- Identity

    // double norm = 0;
    for (uint32_t i = 0; i < length; ++i)
    {
      memset(tmp, 0, sizeof(float) * (m + 1));
      weight& w = all->weights.strided_index(i);
      for (int j = 1; j <= m; j++)
      {
        for (int h = 1; h <= m; ++h) tmp[j] += A[j][h] * D[h] * (&w)[h];
      }
      for (int j = 1; j <= m; ++j)
      {
        // norm = max(norm, fabs(tmp[j]));
        (&w)[j] = tmp[j];
      }
    }
    // printf("|Z| = %f\n", norm);

    for (int i = 1; i <= m; i++)
    {
      memset(A[i], 0, sizeof(double) * (m + 1));
      D[i] = 1;
      A[i][i] = 1;
    }
  }